

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O3

QRect __thiscall
QFusionStyle::subElementRect(QFusionStyle *this,SubElement sr,QStyleOption *opt,QWidget *w)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  QRect *pQVar4;
  ulong uVar5;
  QRect QVar6;
  Representation local_18;
  Representation RStack_14;
  
  QVar6 = QCommonStyle::subElementRect(&this->super_QCommonStyle,sr,opt,w);
  uVar5 = QVar6._8_8_;
  local_18.m_i = (int)QVar6._0_8_;
  RStack_14.m_i = SUB84(QVar6._0_8_,4);
  if (sr - SE_ProgressBarGroove < 3) {
    uVar5._0_4_ = (opt->rect).x2;
    uVar5._4_4_ = (opt->rect).y2;
    pQVar4 = &opt->rect;
    goto LAB_003bba5b;
  }
  if (sr == SE_PushButtonFocusRect) {
    RStack_14.m_i = QVar6.y1.m_i.m_i + 1;
    local_18.m_i = QVar6.x1.m_i.m_i;
    lVar3 = -0x100000000;
  }
  else {
    pQVar4 = (QRect *)&local_18;
    if ((((sr != SE_DockWidgetTitleBarText) ||
         (pQVar4 = (QRect *)&local_18, opt == (QStyleOption *)0x0)) ||
        (pQVar4 = (QRect *)&local_18, opt->version < 1)) ||
       (pQVar4 = (QRect *)&local_18, opt->type != 9)) goto LAB_003bba5b;
    if (*(char *)((long)&opt[1].rect.x2.m_i + 3) != '\x01') {
      if (opt->direction == LeftToRight) {
        RStack_14.m_i = QVar6.y1.m_i.m_i;
        local_18.m_i = QVar6.x1.m_i.m_i + 4;
        pQVar4 = (QRect *)&local_18;
      }
      else {
        uVar5 = uVar5 & 0xffffffff00000000 | (ulong)(QVar6.x2.m_i.m_i - 4);
        pQVar4 = (QRect *)&local_18;
      }
      goto LAB_003bba5b;
    }
    lVar3 = -0x400000000;
  }
  uVar5 = uVar5 + lVar3;
  pQVar4 = (QRect *)&local_18;
LAB_003bba5b:
  uVar1 = pQVar4->x1;
  uVar2 = pQVar4->y1;
  QVar6.y1.m_i = uVar2;
  QVar6.x1.m_i = uVar1;
  QVar6.x2.m_i = (int)uVar5;
  QVar6.y2.m_i = (int)(uVar5 >> 0x20);
  return QVar6;
}

Assistant:

QRect QFusionStyle::subElementRect(SubElement sr, const QStyleOption *opt, const QWidget *w) const
{
    QRect r = QCommonStyle::subElementRect(sr, opt, w);
    switch (sr) {
    case SE_ProgressBarLabel:
    case SE_ProgressBarContents:
    case SE_ProgressBarGroove:
        return opt->rect;
    case SE_PushButtonFocusRect:
        r.adjust(0, 1, 0, -1);
        break;
    case SE_DockWidgetTitleBarText: {
        if (const QStyleOptionDockWidget *titlebar = qstyleoption_cast<const QStyleOptionDockWidget*>(opt)) {
            bool verticalTitleBar = titlebar->verticalTitleBar;
            if (verticalTitleBar) {
                r.adjust(0, 0, 0, -4);
            } else {
                if (opt->direction == Qt::LeftToRight)
                    r.adjust(4, 0, 0, 0);
                else
                    r.adjust(0, 0, -4, 0);
            }
        }

        break;
    }
    default:
        break;
    }
    return r;
}